

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirentryinfo_p.h
# Opt level: O0

bool __thiscall QDirEntryInfo::isReadable(QDirEntryInfo *this)

{
  bool bVar1;
  QDirEntryInfo *in_RDI;
  long in_FS_OFFSET;
  QFileInfo *unaff_retaddr;
  MetaDataFlag in_stack_ffffffffffffffdc;
  QDirEntryInfo *this_00;
  undefined1 local_d;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = std::optional::operator_cast_to_bool((optional<QFileInfo> *)0x29795e);
  if (bVar1) {
    std::optional<QFileInfo>::operator->((optional<QFileInfo> *)0x297972);
    local_d = QFileInfo::isReadable(unaff_retaddr);
  }
  else {
    QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)in_RDI,in_stack_ffffffffffffffdc);
    ensureFilled(this_00,(QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
                         SUB84((ulong)lVar2 >> 0x20,0));
    local_d = QFileSystemMetaData::isReadable((QFileSystemMetaData *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_d;
  }
  __stack_chk_fail();
}

Assistant:

bool isReadable() {
        if (fileInfoOpt)
            return fileInfoOpt->isReadable();

        return ensureFilled(QFileSystemMetaData::UserReadPermission).isReadable();
    }